

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  Index IVar1;
  uintptr_t uVar2;
  Type TVar3;
  size_t sVar4;
  LocalGet *tuple;
  TupleExtract *pTVar5;
  Type *pTVar6;
  RefAs *pRVar7;
  size_t i;
  Type local_58;
  Type type;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Builder builder;
  
  local_58.id = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
  if ((local_58.id & 3) == 0 && 6 < local_58.id) {
    TVar3 = getValidLocalType(local_58,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar3.id;
    type.id = (uintptr_t)wasm;
    get = (LocalGet *)Builder::makeRefAs((Builder *)&type,RefAsNonNull,(Expression *)get);
  }
  else if ((local_58.id & 1) != 0 && 6 < local_58.id) {
    TVar3 = getValidLocalType(local_58,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar3.id;
    sVar4 = wasm::Type::size(&local_58);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type,sVar4,
               (allocator_type *)
               &elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
    sVar4 = wasm::Type::size(&local_58);
    for (i = 0; (sVar4 & 0xffffffff) != i; i = i + 1) {
      tuple = get;
      if (i != 0) {
        IVar1 = get->index;
        uVar2 = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
        tuple = MixedArena::alloc<wasm::LocalGet>
                          ((MixedArena *)
                           (elems.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40));
        tuple->index = IVar1;
        (tuple->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar2;
      }
      pTVar5 = Builder::makeTupleExtract
                         ((Builder *)
                          &elems.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)tuple,
                          (Index)i);
      *(TupleExtract **)(type.id + i * 8) = pTVar5;
      pTVar6 = wasm::Type::operator[](&local_58,i);
      if ((pTVar6->id & 3) == 0 && 6 < pTVar6->id) {
        pRVar7 = Builder::makeRefAs((Builder *)
                                    &elems.
                                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,RefAsNonNull
                                    ,*(Expression **)(type.id + i * 8));
        *(RefAs **)(type.id + i * 8) = pRVar7;
      }
    }
    get = (LocalGet *)
          Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                    ((Builder *)
                     &elems.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type);
  }
  return (Expression *)(TupleMake *)get;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  if (get->type.isTuple()) {
    auto type = get->type;
    get->type = getValidLocalType(type, wasm.features);
    std::vector<Expression*> elems(type.size());
    Builder builder(wasm);
    for (Index i = 0, size = type.size(); i < size; ++i) {
      auto* elemGet =
        i == 0 ? get : builder.makeLocalGet(get->index, get->type);
      elems[i] = builder.makeTupleExtract(elemGet, i);
      if (type[i].isNonNullable()) {
        elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
      }
    }
    return builder.makeTupleMake(std::move(elems));
  }
  return get;
}